

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspirehand.hpp
# Opt level: O2

bool __thiscall
InspireHand::getAngle
          (InspireHand *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *fingers)

{
  bool bVar1;
  ssize_t sVar2;
  ostream *poVar3;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  allocator_type local_55;
  ProtoGetAngle p;
  progress_timer t;
  vector<unsigned_char,_std::allocator<unsigned_char>_> recvBuf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sendBuf;
  
  t.super_timer._start_time = clock();
  t.m_os = (ostream *)&std::cout;
  p.super_ProtocolBase._id = this->_id;
  p.super_ProtocolBase._order = '\x11';
  p.super_ProtocolBase._register_address = 0x60a;
  sendBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sendBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sendBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::getRequestBuffer(&p,&sendBuf);
  sVar2 = send(this,(int)&sendBuf,__buf,in_RCX,in_R8D);
  if ((char)sVar2 == '\0') {
    bVar1 = false;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&recvBuf,0x14,&local_55);
    receive(this,&recvBuf,
            (long)recvBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)recvBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
    bVar1 = ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::parseReturnBuffer
                      (&p,&recvBuf,fingers);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"ERROR::InspireHand::GetAngle::Return false");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&recvBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sendBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  boost::progress_timer::~progress_timer(&t);
  return bVar1;
}

Assistant:

bool getAngle(std::vector<uint16_t> &fingers) {
//        fingers.clear();
        boost::progress_timer t;
        ProtoGetAngle p(_id);
        std::vector<uint8_t> sendBuf;
        p.getRequestBuffer(sendBuf);
        if(!send(sendBuf)) {
            return false;
        }

        std::vector<uint8_t> recvBuf(12 + 8);
        receive(recvBuf, recvBuf.size());

        if(!p.parseReturnBuffer(recvBuf, fingers)) {
            std::cout << "ERROR::InspireHand::GetAngle::Return false" << std::endl;
            return false;
        }

        return true;
    }